

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::setViewportMargins
          (AbstractScrollArea *this,int left,int top,int right,int bottom)

{
  AbstractScrollAreaPrivate *pAVar1;
  QStyleOption opt;
  
  pAVar1 = (this->d).d;
  pAVar1->left = left;
  pAVar1->top = top;
  pAVar1->right = right;
  pAVar1->bottom = bottom;
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  AbstractScrollAreaPrivate::layoutChildren((this->d).d,&opt);
  AbstractScrollAreaPrivate::normalizePosition((this->d).d);
  AbstractScrollAreaPrivate::calcIndicators((this->d).d);
  QWidget::update();
  QWidget::update();
  QWidget::update();
  QStyleOption::~QStyleOption(&opt);
  return;
}

Assistant:

void
AbstractScrollArea::setViewportMargins( int left, int top,
	int right, int bottom )
{
	d->left = left;
	d->top = top;
	d->right = right;
	d->bottom = bottom;

	QStyleOption opt;
	opt.initFrom( this );
	d->layoutChildren( opt );
	d->normalizePosition();
	d->calcIndicators();

	update();
	d->horIndicator->update();
	d->vertIndicator->update();
}